

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_parse(lysp_ctx *pctx,lysp_stmt *stmt,void **result,lysp_ext_instance **exts)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_submodule *submod_00;
  lysp_ext_instance *type_00;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  lysp_type *type;
  lysp_submodule *submod;
  char *pcStack_58;
  LY_ERR ret__;
  char *str_path;
  lysp_module *mod;
  lysp_restr *restr;
  lysp_node_action_inout *inout;
  uint16_t flags;
  lysp_ext_instance **pplStack_30;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  void **result_local;
  lysp_stmt *stmt_local;
  lysp_ctx *pctx_local;
  
  inout._4_4_ = 0;
  lVar1 = stmt->kw;
  pplStack_30 = exts;
  exts_local = (lysp_ext_instance **)result;
  result_local = &stmt->stmt;
  stmt_local = (lysp_stmt *)pctx;
  if (lVar1 == LY_STMT_NOTIFICATION) {
    LVar2 = lysp_stmt_notif(pctx,stmt,(lysp_node *)0x0,(lysp_node_notif **)result);
    return LVar2;
  }
  if ((lVar1 == LY_STMT_INPUT) || (lVar1 == LY_STMT_OUTPUT)) {
    restr = (lysp_restr *)calloc(1,0x60);
    *exts_local = (lysp_ext_instance *)restr;
    if ((lysp_ext_instance *)restr != (lysp_ext_instance *)0x0) {
      LVar2 = lysp_stmt_inout((lysp_ctx *)stmt_local,(lysp_stmt *)result_local,(lysp_node *)0x0,
                              (lysp_node_action_inout *)restr);
      return LVar2;
    }
    if (stmt_local == (lysp_stmt *)0x0) {
      local_80 = (ly_ctx *)0x0;
    }
    else {
      local_80 = *(ly_ctx **)
                  **(undefined8 **)
                    (*(long *)(stmt_local[1].stmt + 8) +
                    (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
    }
    ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_parse");
    return LY_EMEM;
  }
  if ((lVar1 == LY_STMT_ACTION) || (lVar1 == LY_STMT_RPC)) {
    LVar2 = lysp_stmt_action(pctx,stmt,(lysp_node *)0x0,(lysp_node_action **)result);
    return LVar2;
  }
  if ((lVar1 == LY_STMT_ANYDATA) || (lVar1 == LY_STMT_ANYXML)) {
    LVar2 = lysp_stmt_any(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_AUGMENT) {
    LVar2 = lysp_stmt_augment(pctx,stmt,(lysp_node *)0x0,(lysp_node_augment **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_CASE) {
    LVar2 = lysp_stmt_case(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_CHOICE) {
    LVar2 = lysp_stmt_choice(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_CONTAINER) {
    LVar2 = lysp_stmt_container(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_GROUPING) {
    LVar2 = lysp_stmt_grouping(pctx,stmt,(lysp_node *)0x0,(lysp_node_grp **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_LEAF) {
    LVar2 = lysp_stmt_leaf(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_LEAF_LIST) {
    LVar2 = lysp_stmt_leaflist(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_LIST) {
    LVar2 = lysp_stmt_list(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 == LY_STMT_USES) {
    LVar2 = lysp_stmt_uses(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar2;
  }
  if (lVar1 != LY_STMT_ARGUMENT) {
    if (lVar1 == LY_STMT_BASE) {
      LVar2 = lysp_stmt_text_fields(pctx,stmt,(char ***)result,Y_PREF_IDENTIF_ARG,exts);
      return LVar2;
    }
    if (lVar1 != LY_STMT_BELONGS_TO) {
      if (lVar1 == LY_STMT_BIT) {
LAB_001a9819:
        LVar2 = lysp_stmt_type_enum(pctx,stmt,(lysp_type_enum **)result);
        return LVar2;
      }
      if (lVar1 == LY_STMT_CONFIG) {
        if (*result != (void *)0x0) {
          LVar2 = lysp_stmt_config(pctx,stmt,(uint16_t *)*result,exts);
          return LVar2;
        }
        __assert_fail("*result",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                      ,0xd84,
                      "LY_ERR lysp_stmt_parse(struct lysp_ctx *, const struct lysp_stmt *, void **, struct lysp_ext_instance **)"
                     );
      }
      if (lVar1 != LY_STMT_CONTACT) {
        if (lVar1 == LY_STMT_DEFAULT) {
LAB_001a987d:
          LVar2 = lysp_stmt_qnames(pctx,stmt,(lysp_qname **)result,Y_STR_ARG,exts);
          return LVar2;
        }
        if (lVar1 != LY_STMT_DESCRIPTION) {
          if (lVar1 == LY_STMT_DEVIATE) {
            LVar2 = lysp_stmt_deviate(pctx,stmt,(lysp_deviate **)result,exts);
            return LVar2;
          }
          if (lVar1 == LY_STMT_DEVIATION) {
            LVar2 = lysp_stmt_deviation(pctx,stmt,(lysp_deviation **)result);
            return LVar2;
          }
          if (lVar1 == LY_STMT_ENUM) goto LAB_001a9819;
          if ((lVar1 != LY_STMT_ERROR_APP_TAG) && (lVar1 != LY_STMT_ERROR_MESSAGE)) {
            if (lVar1 == LY_STMT_EXTENSION) {
              LVar2 = lysp_stmt_extension(pctx,stmt,(lysp_ext **)result);
              return LVar2;
            }
            if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
              LVar2 = lysp_stmt_ext(pctx,stmt,LY_STMT_EXTENSION_INSTANCE,0,
                                    (lysp_ext_instance **)result);
              return LVar2;
            }
            if (lVar1 == LY_STMT_FEATURE) {
              LVar2 = lysp_stmt_feature(pctx,stmt,(lysp_feature **)result);
              return LVar2;
            }
            if (lVar1 == LY_STMT_FRACTION_DIGITS) {
              LVar2 = lysp_stmt_type_fracdigits(pctx,stmt,(uint8_t *)*result,exts);
              return LVar2;
            }
            if (lVar1 == LY_STMT_IDENTITY) {
              LVar2 = lysp_stmt_identity(pctx,stmt,(lysp_ident **)result);
              return LVar2;
            }
            if (lVar1 == LY_STMT_IF_FEATURE) goto LAB_001a987d;
            if (lVar1 == LY_STMT_IMPORT) {
              LVar2 = lysp_stmt_import(pctx,stmt,(lysp_import **)result);
              return LVar2;
            }
            if (lVar1 == LY_STMT_INCLUDE) {
              LVar2 = lysp_stmt_include(pctx,stmt,(lysp_include **)result);
              return LVar2;
            }
            if (lVar1 != LY_STMT_KEY) {
              if (lVar1 == LY_STMT_LENGTH) {
LAB_001a9949:
                mod = (lysp_module *)calloc(1,0x40);
                *exts_local = (lysp_ext_instance *)mod;
                if (mod != (lysp_module *)0x0) {
                  LVar2 = lysp_stmt_restr((lysp_ctx *)stmt_local,(lysp_stmt *)result_local,
                                          (lysp_restr *)mod);
                  return LVar2;
                }
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_88 = (ly_ctx *)0x0;
                }
                else {
                  local_88 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lysp_stmt_parse");
                return LY_EMEM;
              }
              if (lVar1 == LY_STMT_MANDATORY) {
                LVar2 = lysp_stmt_mandatory(pctx,stmt,(uint16_t *)*result,exts);
                return LVar2;
              }
              if (lVar1 == LY_STMT_MAX_ELEMENTS) {
                inout._2_2_ = 0;
                LVar2 = lysp_stmt_maxelements
                                  (pctx,stmt,(uint32_t *)*result,(uint16_t *)((long)&inout + 2),exts
                                  );
                return LVar2;
              }
              if (lVar1 == LY_STMT_MIN_ELEMENTS) {
                inout._2_2_ = 0;
                LVar2 = lysp_stmt_minelements
                                  (pctx,stmt,(uint32_t *)*result,(uint16_t *)((long)&inout + 2),exts
                                  );
                return LVar2;
              }
              if (lVar1 == LY_STMT_MODIFIER) {
                LVar2 = lysp_stmt_type_pattern_modifier(pctx,stmt,(char **)result,exts);
                return LVar2;
              }
              if (lVar1 == LY_STMT_MODULE) {
                str_path = (char *)calloc(1,0x80);
                *exts_local = (lysp_ext_instance *)str_path;
                if ((lysp_module *)str_path != (lysp_module *)0x0) {
                  LVar2 = lysp_stmt_module((lysp_ctx *)stmt_local,(lysp_stmt *)result_local,
                                           (lysp_module *)str_path);
                  return LVar2;
                }
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_90 = (ly_ctx *)0x0;
                }
                else {
                  local_90 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lysp_stmt_parse");
                return LY_EMEM;
              }
              if (lVar1 == LY_STMT_MUST) {
                LVar2 = lysp_stmt_restrs(pctx,stmt,(lysp_restr **)result);
                return LVar2;
              }
              if (lVar1 != LY_STMT_NAMESPACE) {
                if (lVar1 == LY_STMT_ORDERED_BY) {
                  LVar2 = lysp_stmt_orderedby(pctx,stmt,(uint16_t *)*result,exts);
                  return LVar2;
                }
                if (lVar1 != LY_STMT_ORGANIZATION) {
                  if (lVar1 == LY_STMT_PATH) {
                    pcStack_58 = (char *)0x0;
                    LVar2 = lysp_stmt_text_field
                                      (pctx,stmt,0,&stack0xffffffffffffffa8,Y_STR_ARG,exts);
                    if (LVar2 == LY_SUCCESS) {
                      if (stmt_local == (lysp_stmt *)0x0) {
                        local_98 = (ly_ctx *)0x0;
                      }
                      else {
                        local_98 = *(ly_ctx **)
                                    **(undefined8 **)
                                      (*(long *)(stmt_local[1].stmt + 8) +
                                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                      }
                      inout._4_4_ = ly_path_parse(local_98,(lysc_node *)0x0,pcStack_58,0,'\x01',2,
                                                  0x10,0x400,(lyxp_expr **)exts_local);
                      if (stmt_local == (lysp_stmt *)0x0) {
                        local_a0 = (ly_ctx *)0x0;
                      }
                      else {
                        local_a0 = *(ly_ctx **)
                                    **(undefined8 **)
                                      (*(long *)(stmt_local[1].stmt + 8) +
                                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                      }
                      lydict_remove(local_a0,pcStack_58);
                      return inout._4_4_;
                    }
                    return LVar2;
                  }
                  if (lVar1 == LY_STMT_PATTERN) {
                    LVar2 = lysp_stmt_type_pattern(pctx,stmt,(lysp_restr **)result);
                    return LVar2;
                  }
                  if (lVar1 == LY_STMT_POSITION) {
LAB_001a9cd4:
                    inout._2_2_ = 0;
                    LVar2 = lysp_stmt_type_enum_value_pos
                                      (pctx,stmt,(int64_t *)*result,(uint16_t *)((long)&inout + 2),
                                       exts);
                    return LVar2;
                  }
                  if (lVar1 == LY_STMT_PREFIX) {
                    LVar2 = lysp_stmt_text_field(pctx,stmt,0,(char **)result,Y_IDENTIF_ARG,exts);
                    return LVar2;
                  }
                  if (lVar1 != LY_STMT_PRESENCE) {
                    if (lVar1 == LY_STMT_RANGE) goto LAB_001a9949;
                    if (lVar1 != LY_STMT_REFERENCE) {
                      if (lVar1 == LY_STMT_REFINE) {
                        LVar2 = lysp_stmt_refine(pctx,stmt,(lysp_refine **)result);
                        return LVar2;
                      }
                      if (lVar1 == LY_STMT_REQUIRE_INSTANCE) {
                        inout._2_2_ = 0;
                        LVar2 = lysp_stmt_type_reqinstance
                                          (pctx,stmt,(uint8_t *)*result,
                                           (uint16_t *)((long)&inout + 2),exts);
                        return LVar2;
                      }
                      if (lVar1 == LY_STMT_REVISION) {
                        LVar2 = lysp_stmt_revision(pctx,stmt,(lysp_revision **)result);
                        return LVar2;
                      }
                      if (lVar1 != LY_STMT_REVISION_DATE) {
                        if (lVar1 == LY_STMT_STATUS) {
                          LVar2 = lysp_stmt_status(pctx,stmt,(uint16_t *)result,exts);
                          return LVar2;
                        }
                        if (lVar1 == LY_STMT_SUBMODULE) {
                          submod_00 = (lysp_submodule *)calloc(1,0xb8);
                          *exts_local = (lysp_ext_instance *)submod_00;
                          if (submod_00 != (lysp_submodule *)0x0) {
                            LVar2 = lysp_stmt_submodule((lysp_ctx *)stmt_local,
                                                        (lysp_stmt *)result_local,submod_00);
                            return LVar2;
                          }
                          if (stmt_local == (lysp_stmt *)0x0) {
                            local_a8 = (ly_ctx *)0x0;
                          }
                          else {
                            local_a8 = *(ly_ctx **)
                                        **(undefined8 **)
                                          (*(long *)(stmt_local[1].stmt + 8) +
                                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                          }
                          ly_log(local_a8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                 "lysp_stmt_parse");
                          return LY_EMEM;
                        }
                        if (lVar1 == LY_STMT_TYPE) {
                          type_00 = (lysp_ext_instance *)calloc(1,0x68);
                          *exts_local = type_00;
                          if (type_00 != (lysp_ext_instance *)0x0) {
                            LVar2 = lysp_stmt_type((lysp_ctx *)stmt_local,(lysp_stmt *)result_local,
                                                   (lysp_type *)type_00);
                            return LVar2;
                          }
                          if (stmt_local == (lysp_stmt *)0x0) {
                            local_b0 = (ly_ctx *)0x0;
                          }
                          else {
                            local_b0 = *(ly_ctx **)
                                        **(undefined8 **)
                                          (*(long *)(stmt_local[1].stmt + 8) +
                                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                          }
                          ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                 "lysp_stmt_parse");
                          return LY_EMEM;
                        }
                        if (lVar1 == LY_STMT_TYPEDEF) {
                          LVar2 = lysp_stmt_typedef(pctx,stmt,(lysp_node *)0x0,(lysp_tpdf **)result)
                          ;
                          return LVar2;
                        }
                        if (lVar1 == LY_STMT_UNIQUE) goto LAB_001a987d;
                        if (lVar1 != LY_STMT_UNITS) {
                          if (lVar1 != LY_STMT_VALUE) {
                            if (lVar1 == LY_STMT_WHEN) {
                              LVar2 = lysp_stmt_when(pctx,stmt,(lysp_when **)result);
                              return LVar2;
                            }
                            if (lVar1 != LY_STMT_YANG_VERSION) {
                              if (lVar1 == LY_STMT_YIN_ELEMENT) {
                                LVar2 = lysp_stmt_yinelem(pctx,stmt,(uint16_t *)*result,exts);
                                return LVar2;
                              }
                              if (pctx == (lysp_ctx *)0x0) {
                                local_b8 = (ly_ctx *)0x0;
                              }
                              else {
                                local_b8 = (ly_ctx *)
                                           **(undefined8 **)
                                             (pctx->parsed_mods->field_2).dnodes
                                             [pctx->parsed_mods->count - 1];
                              }
                              ly_log(local_b8,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                     "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                                     ,0xe0b);
                              return LY_EINT;
                            }
                            LVar2 = lysp_stmt_yangver(pctx,stmt,(uint8_t *)*result,exts);
                            return LVar2;
                          }
                          goto LAB_001a9cd4;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  LVar2 = lysp_stmt_text_field(pctx,stmt,0,(char **)result,Y_STR_ARG,exts);
  return LVar2;
}

Assistant:

static LY_ERR
lysp_stmt_parse(struct lysp_ctx *pctx, const struct lysp_stmt *stmt, void **result, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    uint16_t flags;

    switch (stmt->kw) {
    case LY_STMT_NOTIFICATION:
        ret = lysp_stmt_notif(pctx, stmt, NULL, (struct lysp_node_notif **)result);
        break;
    case LY_STMT_INPUT:
    case LY_STMT_OUTPUT: {
        struct lysp_node_action_inout *inout;

        *result = inout = calloc(1, sizeof *inout);
        LY_CHECK_ERR_RET(!inout, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_inout(pctx, stmt, NULL, inout);
        break;
    }
    case LY_STMT_ACTION:
    case LY_STMT_RPC:
        ret = lysp_stmt_action(pctx, stmt, NULL, (struct lysp_node_action **)result);
        break;
    case LY_STMT_ANYDATA:
    case LY_STMT_ANYXML:
        ret = lysp_stmt_any(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_AUGMENT:
        ret = lysp_stmt_augment(pctx, stmt, NULL, (struct lysp_node_augment **)result);
        break;
    case LY_STMT_CASE:
        ret = lysp_stmt_case(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_CHOICE:
        ret = lysp_stmt_choice(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_CONTAINER:
        ret = lysp_stmt_container(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_GROUPING:
        ret = lysp_stmt_grouping(pctx, stmt, NULL, (struct lysp_node_grp **)result);
        break;
    case LY_STMT_LEAF:
        ret = lysp_stmt_leaf(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_LEAF_LIST:
        ret = lysp_stmt_leaflist(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_LIST:
        ret = lysp_stmt_list(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_USES:
        ret = lysp_stmt_uses(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_BASE:
        ret = lysp_stmt_text_fields(pctx, stmt, (const char ***)result, Y_PREF_IDENTIF_ARG, exts);
        break;
    case LY_STMT_ARGUMENT:
    case LY_STMT_BELONGS_TO:
    case LY_STMT_CONTACT:
    case LY_STMT_DESCRIPTION:
    case LY_STMT_ERROR_APP_TAG:
    case LY_STMT_ERROR_MESSAGE:
    case LY_STMT_KEY:
    case LY_STMT_NAMESPACE:
    case LY_STMT_ORGANIZATION:
    case LY_STMT_PRESENCE:
    case LY_STMT_REFERENCE:
    case LY_STMT_REVISION_DATE:
    case LY_STMT_UNITS:
        ret = lysp_stmt_text_field(pctx, stmt, 0, (const char **)result, Y_STR_ARG, exts);
        break;
    case LY_STMT_BIT:
    case LY_STMT_ENUM:
        ret = lysp_stmt_type_enum(pctx, stmt, (struct lysp_type_enum **)result);
        break;
    case LY_STMT_CONFIG:
        assert(*result);
        ret = lysp_stmt_config(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_DEFAULT:
    case LY_STMT_IF_FEATURE:
    case LY_STMT_UNIQUE:
        ret = lysp_stmt_qnames(pctx, stmt, (struct lysp_qname **)result, Y_STR_ARG, exts);
        break;
    case LY_STMT_DEVIATE:
        ret = lysp_stmt_deviate(pctx, stmt, (struct lysp_deviate **)result, exts);
        break;
    case LY_STMT_DEVIATION:
        ret = lysp_stmt_deviation(pctx, stmt, (struct lysp_deviation **)result);
        break;
    case LY_STMT_EXTENSION:
        ret = lysp_stmt_extension(pctx, stmt, (struct lysp_ext **)result);
        break;
    case LY_STMT_EXTENSION_INSTANCE:
        ret = lysp_stmt_ext(pctx, stmt, LY_STMT_EXTENSION_INSTANCE, 0, (struct lysp_ext_instance **)result);
        break;
    case LY_STMT_FEATURE:
        ret = lysp_stmt_feature(pctx, stmt, (struct lysp_feature **)result);
        break;
    case LY_STMT_FRACTION_DIGITS:
        ret = lysp_stmt_type_fracdigits(pctx, stmt, *(uint8_t **)result, exts);
        break;
    case LY_STMT_LENGTH:
    case LY_STMT_RANGE: {
        struct lysp_restr *restr;

        *result = restr = calloc(1, sizeof *restr);
        LY_CHECK_ERR_RET(!restr, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);

        ret = lysp_stmt_restr(pctx, stmt, restr);
        break;
    }
    case LY_STMT_MUST:
        ret = lysp_stmt_restrs(pctx, stmt, (struct lysp_restr **)result);
        break;
    case LY_STMT_IDENTITY:
        ret = lysp_stmt_identity(pctx, stmt, (struct lysp_ident **)result);
        break;
    case LY_STMT_IMPORT:
        ret = lysp_stmt_import(pctx, stmt, (struct lysp_import **)result);
        break;
    case LY_STMT_INCLUDE:
        ret = lysp_stmt_include(pctx, stmt, (struct lysp_include **)result);
        break;
    case LY_STMT_MANDATORY:
        ret = lysp_stmt_mandatory(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_MAX_ELEMENTS:
        flags = 0;
        ret = lysp_stmt_maxelements(pctx, stmt, *(uint32_t **)result, &flags, exts);
        break;
    case LY_STMT_MIN_ELEMENTS:
        flags = 0;
        ret = lysp_stmt_minelements(pctx, stmt, *(uint32_t **)result, &flags, exts);
        break;
    case LY_STMT_MODIFIER:
        ret = lysp_stmt_type_pattern_modifier(pctx, stmt, (const char **)result, exts);
        break;
    case LY_STMT_MODULE: {
        struct lysp_module *mod;

        *result = mod = calloc(1, sizeof *mod);
        LY_CHECK_ERR_RET(!mod, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_module(pctx, stmt, mod);
        break;
    }
    case LY_STMT_ORDERED_BY:
        ret = lysp_stmt_orderedby(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_PATH: {
        const char *str_path = NULL;

        LY_CHECK_RET(lysp_stmt_text_field(pctx, stmt, 0, &str_path, Y_STR_ARG, exts));
        ret = ly_path_parse(PARSER_CTX(pctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, (struct lyxp_expr **)result);
        lydict_remove(PARSER_CTX(pctx), str_path);
        break;
    }
    case LY_STMT_PATTERN:
        ret = lysp_stmt_type_pattern(pctx, stmt, (struct lysp_restr **)result);
        break;
    case LY_STMT_POSITION:
    case LY_STMT_VALUE:
        flags = 0;
        ret = lysp_stmt_type_enum_value_pos(pctx, stmt, *(int64_t **)result, &flags, exts);
        break;
    case LY_STMT_PREFIX:
        ret = lysp_stmt_text_field(pctx, stmt, 0, (const char **)result, Y_IDENTIF_ARG, exts);
        break;
    case LY_STMT_REFINE:
        ret = lysp_stmt_refine(pctx, stmt, (struct lysp_refine **)result);
        break;
    case LY_STMT_REQUIRE_INSTANCE:
        flags = 0;
        ret = lysp_stmt_type_reqinstance(pctx, stmt, *(uint8_t **)result, &flags, exts);
        break;
    case LY_STMT_REVISION:
        ret = lysp_stmt_revision(pctx, stmt, (struct lysp_revision **)result);
        break;
    case LY_STMT_STATUS:
        ret = lysp_stmt_status(pctx, stmt, (uint16_t *)result, exts);
        break;
    case LY_STMT_SUBMODULE: {
        struct lysp_submodule *submod;

        *result = submod = calloc(1, sizeof *submod);
        LY_CHECK_ERR_RET(!submod, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_submodule(pctx, stmt, submod);
        break;
    }
    case LY_STMT_TYPE: {
        struct lysp_type *type;

        *result = type = calloc(1, sizeof *type);
        LY_CHECK_ERR_RET(!type, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_type(pctx, stmt, type);
        break;
    }
    case LY_STMT_TYPEDEF:
        ret = lysp_stmt_typedef(pctx, stmt, NULL, (struct lysp_tpdf **)result);
        break;
    case LY_STMT_WHEN:
        ret = lysp_stmt_when(pctx, stmt, (struct lysp_when **)result);
        break;
    case LY_STMT_YANG_VERSION:
        ret = lysp_stmt_yangver(pctx, stmt, *(uint8_t **)result, exts);
        break;
    case LY_STMT_YIN_ELEMENT:
        ret = lysp_stmt_yinelem(pctx, stmt, *(uint16_t **)result, exts);
        break;
    default:
        LOGINT(PARSER_CTX(pctx));
        return LY_EINT;
    }

    return ret;
}